

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

int helics::apps::addUsedPotentialInterfaceTemplates
              (json *potentialCommand,
              vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              *potentials,string *possibleFed,int logLevel,string *type,Federate *fed)

{
  initializer_list_t init;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view message;
  format_args args;
  string_view fmt;
  bool bVar1;
  Federate *this;
  reference pvVar2;
  int in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *in_R9;
  TemplateMatcher *ifaceTemplate_1;
  iterator __end3;
  iterator __begin3;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *__range3;
  TemplateMatcher *ifaceTemplate;
  iterator __end2;
  iterator __begin2;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *__range2;
  bool hasInterfaceTemplates;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
  *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  iterator in_stack_fffffffffffffd90;
  value<fmt::v11::context> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  char *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  undefined8 in_stack_fffffffffffffdc0;
  undefined1 local_230 [8];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdd8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffde0;
  key_type *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  undefined1 local_200 [32];
  __sv_type local_1e0;
  char local_1c0 [32];
  __sv_type local_1a0;
  size_t local_190;
  char *local_188;
  reference local_180;
  TemplateMatcher *local_178;
  __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
  local_170;
  undefined8 local_168;
  TemplateMatcher *in_stack_fffffffffffffed8;
  __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
  local_e0 [2];
  byte local_c9;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  int local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined8 local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  char local_98 [48];
  undefined8 local_68;
  char *local_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *local_58;
  undefined8 uStack_50;
  undefined1 *local_40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *local_28;
  unsigned_long_long uVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  
  local_c9 = 0;
  local_c8 = in_R9;
  local_c0 = in_R8;
  local_b4 = in_ECX;
  local_b0 = in_RDX;
  local_a8 = in_RSI;
  local_a0 = in_RDI;
  local_e0[0]._M_current =
       (TemplateMatcher *)
       CLI::std::
       vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::begin
                 (in_stack_fffffffffffffd78);
  CLI::std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
  end(in_stack_fffffffffffffd78);
  do {
    bVar1 = __gnu_cxx::
            operator==<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                      ((__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                        *)in_stack_fffffffffffffd80,
                       (__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                        *)in_stack_fffffffffffffd78);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0026a6b8:
      if ((local_c9 & 1) != 0) {
        CLI::std::
        initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::initializer_list((initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                            *)&stack0xfffffffffffffed0);
        init._M_len = (size_type)in_stack_fffffffffffffd98;
        init._M_array = in_stack_fffffffffffffd90;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::array(init);
        __str = local_a0;
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdc0,local_a0);
        this = (Federate *)
               nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        std::__cxx11::string::~string(in_stack_fffffffffffffd80);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffd80);
        local_168 = local_a8;
        local_170._M_current =
             (TemplateMatcher *)
             CLI::std::
             vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
             begin(in_stack_fffffffffffffd78);
        local_178 = (TemplateMatcher *)
                    CLI::std::
                    vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                    ::end(in_stack_fffffffffffffd78);
        while (bVar1 = __gnu_cxx::
                       operator==<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                                 ((__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                                   *)in_stack_fffffffffffffd80,
                                  (__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                                   *)in_stack_fffffffffffffd78), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_180 = __gnu_cxx::
                      __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                      ::operator*(&local_170);
          local_190 = (local_180->federate)._M_len;
          local_188 = (local_180->federate)._M_str;
          local_1a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffffd80);
          __x_00._M_len._4_4_ = in_stack_fffffffffffffdac;
          __x_00._M_len._0_4_ = in_stack_fffffffffffffda8;
          __x_00._M_str = (char *)this;
          __y_00._M_str = in_stack_fffffffffffffda0;
          __y_00._M_len = (size_t)in_stack_fffffffffffffd98;
          bVar1 = std::operator==(__x_00,__y_00);
          if ((((bVar1 ^ 0xffU) & 1) == 0) &&
             (bVar1 = TemplateMatcher::isUsed((TemplateMatcher *)0x26a88d), bVar1)) {
            in_stack_fffffffffffffda0 = local_1c0;
            in_stack_fffffffffffffd98 = local_a0;
            std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdc0,__str);
            pvVar2 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
            in_stack_fffffffffffffda8 = SUB84(pvVar2,0);
            in_stack_fffffffffffffdac = (int)((ulong)pvVar2 >> 0x20);
            TemplateMatcher::usedInterfaceGeneration_abi_cxx11_(in_stack_fffffffffffffed8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffffd80);
            std::__cxx11::string::~string(in_stack_fffffffffffffd80);
            if (8 < local_b4) {
              in_stack_fffffffffffffdf0 = "federate {} request {} {}";
              this_00 = (value<fmt::v11::context> *)&stack0xfffffffffffffdc0;
              in_stack_fffffffffffffd78 = local_c8;
              in_stack_fffffffffffffd80 = local_b0;
              x = local_c0;
              TemplateMatcher::usedInterfaceGeneration_abi_cxx11_(in_stack_fffffffffffffed8);
              fileops::generateJsonString
                        ((json *)x,SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0));
              aVar4.values_ = (value<fmt::v11::context> *)local_200;
              uVar3 = 0x19;
              local_40 = local_230;
              uStack_50 = 0x19;
              local_58 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffdf0;
              local_28 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffdf0;
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                        (this_00,x);
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                        (this_00,x);
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                        (this_00,x);
              local_60 = local_98;
              local_68 = 0xddd;
              fmt.size_ = (size_t)&local_68;
              fmt.data_ = local_60;
              args.field_1.values_ = aVar4.values_;
              args.desc_ = uVar3;
              ::fmt::v11::vformat_abi_cxx11_(fmt,args);
              local_1e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    (in_stack_fffffffffffffd80);
              message._M_str = (char *)in_stack_fffffffffffffdc0;
              message._M_len = (size_t)__str;
              Federate::logMessage(this,in_stack_fffffffffffffdac,message);
              std::__cxx11::string::~string(in_stack_fffffffffffffd80);
              std::__cxx11::string::~string(in_stack_fffffffffffffd80);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffffd80);
            }
          }
          __gnu_cxx::
          __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
          ::operator++(&local_170);
        }
      }
      return 0;
    }
    __gnu_cxx::
    __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
    ::operator*(local_e0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd80);
    __x._M_len._4_4_ = in_stack_fffffffffffffdac;
    __x._M_len._0_4_ = in_stack_fffffffffffffda8;
    __x._M_str = in_stack_fffffffffffffdb0;
    __y._M_str = in_stack_fffffffffffffda0;
    __y._M_len = (size_t)in_stack_fffffffffffffd98;
    bVar1 = std::operator==(__x,__y);
    if ((((bVar1 ^ 0xffU) & 1) == 0) &&
       (bVar1 = TemplateMatcher::isUsed((TemplateMatcher *)0x26a696), bVar1)) {
      local_c9 = 1;
      goto LAB_0026a6b8;
    }
    __gnu_cxx::
    __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
    ::operator++(local_e0);
  } while( true );
}

Assistant:

static int addUsedPotentialInterfaceTemplates(nlohmann::json& potentialCommand,
                                              std::vector<TemplateMatcher>& potentials,
                                              const std::string& possibleFed,
                                              int logLevel,
                                              const std::string& type,
                                              Federate* fed)
{
    bool hasInterfaceTemplates{false};
    for (auto& ifaceTemplate : potentials) {
        if (ifaceTemplate.federate != possibleFed) {
            continue;
        }
        if (!ifaceTemplate.isUsed()) {
            continue;
        }
        hasInterfaceTemplates = true;
        break;
    }
    if (hasInterfaceTemplates) {
        potentialCommand[type] = nlohmann::json::array();
        for (auto& ifaceTemplate : potentials) {
            if (ifaceTemplate.federate != possibleFed) {
                continue;
            }
            if (!ifaceTemplate.isUsed()) {
                continue;
            }
            potentialCommand[type].push_back(ifaceTemplate.usedInterfaceGeneration());
            if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
                fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                                fmt::format("federate {} request {} {}",
                                            possibleFed,
                                            type,
                                            fileops::generateJsonString(
                                                ifaceTemplate.usedInterfaceGeneration())));
            }
        }
    }
    return 0;
}